

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_linear.h
# Opt level: O2

void XrMatrix4x4f_CreateTranslationRotationScale
               (XrMatrix4x4f *result,XrVector3f *translation,XrQuaternionf *rotation,
               XrVector3f *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  XrMatrix4x4f combinedMatrix;
  XrMatrix4x4f rotationMatrix;
  XrMatrix4x4f scaleMatrix;
  XrMatrix4x4f XStack_118;
  XrMatrix4x4f local_d8;
  XrMatrix4x4f local_98;
  XrMatrix4x4f local_58;
  
  local_58.m[0] = scale->x;
  local_58.m[5] = scale->y;
  local_58.m[10] = scale->z;
  local_58.m[1] = 0.0;
  local_58.m[2] = 0.0;
  local_58.m[3] = 0.0;
  local_58.m[4] = 0.0;
  local_58.m[6] = 0.0;
  local_58.m[7] = 0.0;
  local_58.m[8] = 0.0;
  local_58.m[9] = 0.0;
  local_58.m[0xb] = 0.0;
  local_58.m[0xc] = 0.0;
  local_58.m[0xd] = 0.0;
  local_58.m[0xe] = 0.0;
  local_58.m[0xf] = 1.0;
  fVar1 = rotation->x;
  fVar2 = rotation->y;
  fVar5 = fVar2 + fVar2;
  fVar3 = rotation->z;
  fVar6 = fVar3 + fVar3;
  fVar4 = rotation->w;
  local_98.m[9] = (fVar1 + fVar1) * fVar4;
  local_98.m[0] = (1.0 - fVar2 * fVar5) - fVar3 * fVar6;
  local_98.m[1] = fVar1 * fVar5 + fVar4 * fVar6;
  local_98.m[2] = fVar6 * fVar1 - fVar5 * fVar4;
  local_98.m[3] = 0.0;
  local_98.m[4] = fVar1 * fVar5 - fVar4 * fVar6;
  local_98.m[10] = 1.0 - fVar1 * (fVar1 + fVar1);
  local_98.m[5] = local_98.m[10] - fVar3 * fVar6;
  local_98.m[6] = fVar2 * fVar6 + local_98.m[9];
  local_98.m[7] = 0.0;
  local_98.m[8] = fVar6 * fVar1 + fVar5 * fVar4;
  local_98.m[9] = fVar2 * fVar6 - local_98.m[9];
  local_98.m[10] = local_98.m[10] - fVar2 * fVar5;
  local_98.m[0xb] = 0.0;
  local_98.m[0xc] = 0.0;
  local_98.m[0xd] = 0.0;
  local_98.m[0xe] = 0.0;
  local_98.m[0xf] = 1.0;
  local_d8.m[0xe] = translation->z;
  local_d8.m[0] = 1.0;
  local_d8.m[1] = 0.0;
  local_d8.m[2] = 0.0;
  local_d8.m[3] = 0.0;
  local_d8.m[4] = 0.0;
  local_d8.m[5] = 1.0;
  local_d8.m[6] = 0.0;
  local_d8.m[7] = 0.0;
  local_d8.m[8] = 0.0;
  local_d8.m[9] = 0.0;
  local_d8.m[10] = 1.0;
  local_d8.m[0xb] = 0.0;
  local_d8.m[0xc] = translation->x;
  local_d8.m[0xd] = translation->y;
  local_d8.m[0xf] = 1.0;
  XrMatrix4x4f_Multiply(&XStack_118,&local_98,&local_58);
  XrMatrix4x4f_Multiply(result,&local_d8,&XStack_118);
  return;
}

Assistant:

inline static void XrMatrix4x4f_CreateTranslationRotationScale(XrMatrix4x4f* result, const XrVector3f* translation,
                                                               const XrQuaternionf* rotation, const XrVector3f* scale) {
    XrMatrix4x4f scaleMatrix;
    XrMatrix4x4f_CreateScale(&scaleMatrix, scale->x, scale->y, scale->z);

    XrMatrix4x4f rotationMatrix;
    XrMatrix4x4f_CreateFromQuaternion(&rotationMatrix, rotation);

    XrMatrix4x4f translationMatrix;
    XrMatrix4x4f_CreateTranslation(&translationMatrix, translation->x, translation->y, translation->z);

    XrMatrix4x4f combinedMatrix;
    XrMatrix4x4f_Multiply(&combinedMatrix, &rotationMatrix, &scaleMatrix);
    XrMatrix4x4f_Multiply(result, &translationMatrix, &combinedMatrix);
}